

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_panner_process_pcm_frames
                    (ma_panner *pPanner,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  ma_uint64 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_panner *pPanner_local;
  
  if (((pPanner == (ma_panner *)0x0) || (pFramesOut == (void *)0x0)) || (pFramesIn == (void *)0x0))
  {
    pPanner_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    if (pPanner->channels == 2) {
      if (pPanner->mode == ma_pan_mode_balance) {
        ma_stereo_balance_pcm_frames(pFramesOut,pFramesIn,frameCount,pPanner->format,pPanner->pan);
      }
      else {
        ma_stereo_pan_pcm_frames(pFramesOut,pFramesIn,frameCount,pPanner->format,pPanner->pan);
      }
    }
    else if (pPanner->channels == 1) {
      ma_copy_pcm_frames(pFramesOut,pFramesIn,frameCount,pPanner->format,pPanner->channels);
    }
    else {
      ma_copy_pcm_frames(pFramesOut,pFramesIn,frameCount,pPanner->format,pPanner->channels);
    }
    pPanner_local._4_4_ = MA_SUCCESS;
  }
  return pPanner_local._4_4_;
}

Assistant:

MA_API ma_result ma_panner_process_pcm_frames(ma_panner* pPanner, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pPanner == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pPanner->channels == 2) {
        /* Stereo case. For now assume channel 0 is left and channel right is 1, but should probably add support for a channel map. */
        if (pPanner->mode == ma_pan_mode_balance) {
            ma_stereo_balance_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->pan);
        } else {
            ma_stereo_pan_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->pan);
        }
    } else {
        if (pPanner->channels == 1) {
            /* Panning has no effect on mono streams. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->channels);
        } else {
            /* For now we're not going to support non-stereo set ups. Not sure how I want to handle this case just yet. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->channels);
        }
    }

    return MA_SUCCESS;
}